

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib526.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  char *pcVar10;
  long lVar11;
  timeval tVar12;
  int maxfd;
  int running;
  CURL *curl [4];
  timeval interval;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  int local_1f0;
  int local_1ec;
  long local_1e8 [4];
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1e8[0] = 0;
  local_1e8[1] = 0;
  local_1e8[2] = 0;
  local_1e8[3] = 0;
  tv_test_start = tutil_tvnow();
  iVar3 = curl_global_init(3);
  uVar2 = _stderr;
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    uVar6 = curl_easy_strerror(iVar3);
    curl_mfprintf(uVar2,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                  ,0x43,iVar3,uVar6);
  }
  if (iVar3 == 0) {
    lVar8 = 0;
    lVar11 = 0;
    do {
      lVar7 = curl_easy_init();
      local_1e8[lVar11] = lVar7;
      if (lVar7 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                      ,0x47);
        iVar3 = 0x7c;
        goto LAB_0010248a;
      }
      iVar4 = curl_easy_setopt(lVar7,0x2712,URL);
      uVar2 = _stderr;
      iVar3 = 0;
      if (iVar4 != 0) {
        uVar6 = curl_easy_strerror(iVar4);
        curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                      ,0x49,iVar4,uVar6);
        iVar3 = iVar4;
      }
      if (iVar3 != 0) goto LAB_0010248a;
      iVar4 = curl_easy_setopt(lVar7,0x29,1);
      uVar2 = _stderr;
      iVar3 = 0;
      if (iVar4 != 0) {
        uVar6 = curl_easy_strerror(iVar4);
        curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                      ,0x4b,iVar4,uVar6);
        iVar3 = iVar4;
      }
      if (iVar3 != 0) goto LAB_0010248a;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    lVar8 = curl_multi_init();
    if (lVar8 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                    ,0x4e);
      iVar3 = 0x7b;
    }
    else {
      iVar3 = curl_multi_add_handle(lVar8,local_1e8[0]);
      uVar2 = _stderr;
      if (iVar3 == 0) {
        iVar3 = 0;
      }
      else {
        uVar6 = curl_multi_strerror(iVar3);
        curl_mfprintf(uVar2,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                      ,0x50,iVar3,uVar6);
      }
      if (iVar3 == 0) {
        curl_mfprintf(_stderr,"Start at URL 0\n");
        iVar4 = 0;
        iVar3 = 0;
        do {
          local_1f0 = -99;
          local_1c8.tv_sec = 1;
          local_1c8.tv_usec = 0;
          iVar5 = curl_multi_perform(lVar8,&local_1ec);
          uVar2 = _stderr;
          if (iVar5 == 0) {
            if (local_1ec < 0) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                            ,0x5c);
              iVar3 = 0x7a;
            }
          }
          else {
            uVar6 = curl_multi_strerror(iVar5);
            curl_mfprintf(uVar2,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                          ,0x5c,iVar5,uVar6);
            iVar3 = iVar5;
          }
          iVar5 = 0x12;
          if (iVar3 == 0) {
            tVar12 = tutil_tvnow();
            lVar11 = tutil_tvdiff(tVar12,tv_test_start);
            if (lVar11 < 0xea61) {
              if (local_1ec == 0) {
                iVar1 = iVar4 + 1;
                if (iVar4 < 3) {
                  curl_mfprintf(_stderr,"Advancing to URL %d\n",iVar1);
                  iVar4 = curl_multi_add_handle(lVar8,local_1e8[iVar1]);
                  uVar2 = _stderr;
                  iVar3 = 0;
                  if (iVar4 != 0) {
                    uVar6 = curl_multi_strerror(iVar4);
                    curl_mfprintf(uVar2,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                                  ,0x78,iVar4,uVar6);
                    iVar3 = iVar4;
                  }
                  iVar4 = iVar1;
                  if (iVar3 == 0) goto LAB_001025fc;
                }
                else {
                  iVar3 = 0;
                  iVar5 = 0x23;
                  iVar4 = iVar1;
                }
              }
              else {
LAB_001025fc:
                local_b8.__fds_bits[0xe] = 0;
                local_b8.__fds_bits[0xf] = 0;
                local_b8.__fds_bits[0xc] = 0;
                local_b8.__fds_bits[0xd] = 0;
                local_b8.__fds_bits[10] = 0;
                local_b8.__fds_bits[0xb] = 0;
                local_b8.__fds_bits[8] = 0;
                local_b8.__fds_bits[9] = 0;
                local_b8.__fds_bits[6] = 0;
                local_b8.__fds_bits[7] = 0;
                local_b8.__fds_bits[4] = 0;
                local_b8.__fds_bits[5] = 0;
                local_b8.__fds_bits[2] = 0;
                local_b8.__fds_bits[3] = 0;
                local_b8.__fds_bits[0] = 0;
                local_b8.__fds_bits[1] = 0;
                local_138.__fds_bits[0] = 0;
                local_138.__fds_bits[1] = 0;
                local_138.__fds_bits[2] = 0;
                local_138.__fds_bits[3] = 0;
                local_138.__fds_bits[4] = 0;
                local_138.__fds_bits[5] = 0;
                local_138.__fds_bits[6] = 0;
                local_138.__fds_bits[7] = 0;
                local_138.__fds_bits[8] = 0;
                local_138.__fds_bits[9] = 0;
                local_138.__fds_bits[10] = 0;
                local_138.__fds_bits[0xb] = 0;
                local_138.__fds_bits[0xc] = 0;
                local_138.__fds_bits[0xd] = 0;
                local_138.__fds_bits[0xe] = 0;
                local_138.__fds_bits[0xf] = 0;
                local_1b8.__fds_bits[0] = 0;
                local_1b8.__fds_bits[1] = 0;
                local_1b8.__fds_bits[2] = 0;
                local_1b8.__fds_bits[3] = 0;
                local_1b8.__fds_bits[4] = 0;
                local_1b8.__fds_bits[5] = 0;
                local_1b8.__fds_bits[6] = 0;
                local_1b8.__fds_bits[7] = 0;
                local_1b8.__fds_bits[8] = 0;
                local_1b8.__fds_bits[9] = 0;
                local_1b8.__fds_bits[10] = 0;
                local_1b8.__fds_bits[0xb] = 0;
                local_1b8.__fds_bits[0xc] = 0;
                local_1b8.__fds_bits[0xd] = 0;
                local_1b8.__fds_bits[0xe] = 0;
                local_1b8.__fds_bits[0xf] = 0;
                iVar3 = curl_multi_fdset(lVar8,&local_b8,&local_138,&local_1b8,&local_1f0);
                uVar2 = _stderr;
                if (iVar3 == 0) {
                  iVar3 = 0;
                  if (local_1f0 < -1) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                                  ,0x84);
                    iVar3 = 0x7a;
                  }
                }
                else {
                  uVar6 = curl_multi_strerror(iVar3);
                  curl_mfprintf(uVar2,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                                ,0x84,iVar3,uVar6);
                }
                if (iVar3 == 0) {
                  iVar3 = select_wrapper(local_1f0 + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
                  if (iVar3 == -1) {
                    piVar9 = __errno_location();
                    uVar2 = _stderr;
                    iVar3 = *piVar9;
                    pcVar10 = strerror(iVar3);
                    curl_mfprintf(uVar2,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                                  ,0x88,iVar3,pcVar10);
                    iVar3 = 0x79;
                  }
                  else {
                    tVar12 = tutil_tvnow();
                    lVar11 = tutil_tvdiff(tVar12,tv_test_start);
                    iVar3 = 0;
                    if (lVar11 < 0xea61) {
                      iVar5 = 0;
                    }
                    else {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                                    ,0x8a);
                      iVar3 = 0x7d;
                    }
                  }
                }
              }
            }
            else {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib526.c"
                            ,0x5e);
              iVar3 = 0x7d;
            }
          }
        } while (iVar5 == 0);
        if ((iVar5 != 0x23) && (iVar5 != 0x12)) goto LAB_001024bb;
      }
    }
LAB_0010248a:
    lVar11 = 0;
    do {
      lVar7 = local_1e8[lVar11];
      curl_multi_remove_handle(lVar8,lVar7);
      curl_easy_cleanup(lVar7);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    curl_multi_cleanup(lVar8);
    curl_global_cleanup();
  }
LAB_001024bb:
  return iVar3;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int current = 0;
  int i;

  for(i = 0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    easy_init(curl[i]);
    /* specify target */
    easy_setopt(curl[i], CURLOPT_URL, URL);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
  }

  multi_init(m);

  multi_add_handle(m, curl[current]);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
#ifdef LIB527
      /* NOTE: this code does not remove the handle from the multi handle
         here, which would be the nice, sane and documented way of working.
         This however tests that the API survives this abuse gracefully. */
      curl_easy_cleanup(curl[current]);
      curl[current] = NULL;
#endif
      if(++current < NUM_HANDLES) {
        fprintf(stderr, "Advancing to URL %d\n", current);
#ifdef LIB532
        /* first remove the only handle we use */
        curl_multi_remove_handle(m, curl[0]);

        /* make us re-use the same handle all the time, and try resetting
           the handle first too */
        curl_easy_reset(curl[0]);
        easy_setopt(curl[0], CURLOPT_URL, URL);
        /* go verbose */
        easy_setopt(curl[0], CURLOPT_VERBOSE, 1L);

        /* re-add it */
        multi_add_handle(m, curl[0]);
#else
        multi_add_handle(m, curl[current]);
#endif
      }
      else {
        break; /* done */
      }
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

#if defined(LIB526)

  /* test 526 and 528 */
  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }
  curl_multi_cleanup(m);
  curl_global_cleanup();

#elif defined(LIB527)

  /* test 527 */

  /* Upon non-failure test flow the easy's have already been cleanup'ed. In
     case there is a failure we arrive here with easy's that have not been
     cleanup'ed yet, in this case we have to cleanup them or otherwise these
     will be leaked, let's use undocumented cleanup sequence - type UB */

  if(res)
    for(i = 0; i < NUM_HANDLES; i++)
      curl_easy_cleanup(curl[i]);

  curl_multi_cleanup(m);
  curl_global_cleanup();

#elif defined(LIB532)

  /* test 532 */
  /* undocumented cleanup sequence - type UB */

  for(i = 0; i < NUM_HANDLES; i++)
    curl_easy_cleanup(curl[i]);
  curl_multi_cleanup(m);
  curl_global_cleanup();

#endif

  return res;
}